

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O2

void labpack_write_ext(labpack_writer_t *writer,int8_t type,char *data,uint32_t count)

{
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x1f7,
                  "void labpack_write_ext(labpack_writer_t *, int8_t, const char *, uint32_t)");
  }
  if (writer->status == LABPACK_STATUS_OK) {
    if (count == 0 || data != (char *)0x0) {
      mpack_write_ext(writer->encoder,type,data,count);
      labpack_writer_check_encoder(writer);
      return;
    }
    writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
    writer->status_message = "The data cannot be NULL while the count is greater than zero (0)";
  }
  return;
}

Assistant:

void
labpack_write_ext(labpack_writer_t* writer, int8_t type, const char* data, uint32_t count)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!data && count > 0) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = NULL_DATA_MESSAGE;
            return;
        }
        mpack_write_ext(writer->encoder, type, data, count);
        labpack_writer_check_encoder(writer);
    }
}